

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

value_type * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::FindAndConstruct(DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                   *this,DBKeyID *Key)

{
  bool bVar1;
  DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  *local_28;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *TheBucket;
  DBKeyID *Key_local;
  DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  *this_local;
  
  TheBucket = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)Key;
  Key_local = (DBKeyID *)this;
  bVar1 = LookupBucketFor<DBKeyID>
                    (this,Key,(DenseMapPair<DBKeyID,_llbuild::core::KeyID> **)&local_28);
  if (bVar1) {
    this_local = local_28;
  }
  else {
    this_local = (DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                  *)DenseMapBase<llvm::DenseMap<DBKeyID,llbuild::core::KeyID,llvm::DenseMapInfo<DBKeyID>,llvm::detail::DenseMapPair<DBKeyID,llbuild::core::KeyID>>,DBKeyID,llbuild::core::KeyID,llvm::DenseMapInfo<DBKeyID>,llvm::detail::DenseMapPair<DBKeyID,llbuild::core::KeyID>>
                    ::InsertIntoBucket<DBKeyID_const&>
                              ((DenseMapBase<llvm::DenseMap<DBKeyID,llbuild::core::KeyID,llvm::DenseMapInfo<DBKeyID>,llvm::detail::DenseMapPair<DBKeyID,llbuild::core::KeyID>>,DBKeyID,llbuild::core::KeyID,llvm::DenseMapInfo<DBKeyID>,llvm::detail::DenseMapPair<DBKeyID,llbuild::core::KeyID>>
                                *)this,(DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)local_28,
                               (DBKeyID *)TheBucket);
  }
  return (value_type *)this_local;
}

Assistant:

value_type& FindAndConstruct(const KeyT &Key) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return *TheBucket;

    return *InsertIntoBucket(TheBucket, Key);
  }